

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86.cpp
# Opt level: O2

int __thiscall ncnn::LRN_x86::forward_inplace(LRN_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  uint _h;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  pointer piVar5;
  int k;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  void *pvVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  int j;
  ulong uVar20;
  float fVar21;
  float fVar22;
  allocator_type local_179;
  Mat *local_178;
  Option *local_170;
  Mat local_168;
  ulong local_118;
  long local_110;
  void *local_108;
  ulong local_100;
  Mat local_f8;
  void *local_a8;
  void *local_a0;
  long local_98;
  long local_90;
  ulong local_88;
  long local_80;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar6 = bottom_top_blob->w;
  _h = bottom_top_blob->h;
  uVar17 = (ulong)_h;
  uVar19 = bottom_top_blob->c;
  sVar1 = bottom_top_blob->elemsize;
  local_f8.cstep = 0;
  local_f8.data = (void *)0x0;
  local_f8.refcount._0_4_ = 0;
  local_f8.refcount._4_4_ = 0;
  local_f8.elemsize._0_4_ = 0;
  local_f8.elemsize._4_4_ = 0;
  local_f8.elempack = 0;
  local_f8.allocator = (Allocator *)0x0;
  local_f8.dims = 0;
  local_f8.w = 0;
  local_f8.h = 0;
  local_f8.d = 0;
  local_f8.c = 0;
  Mat::create(&local_f8,uVar6,_h,uVar19,sVar1,opt->workspace_allocator);
  iVar10 = -100;
  iVar7 = iVar10;
  if ((local_f8.data == (void *)0x0) || (local_f8.cstep * (long)local_f8.c == 0)) goto LAB_002ebdcf;
  local_110 = (long)(int)uVar6;
  pvVar13 = bottom_top_blob->data;
  sVar2 = bottom_top_blob->cstep;
  uVar16 = 0;
  iVar7 = _h * uVar6;
  if ((int)(_h * uVar6) < 1) {
    iVar7 = 0;
  }
  uVar20 = 0;
  if (0 < (int)uVar19) {
    uVar20 = (ulong)uVar19;
  }
  sVar3 = bottom_top_blob->elemsize;
  pvVar8 = local_f8.data;
  for (; uVar16 != uVar20; uVar16 = uVar16 + 1) {
    for (lVar18 = 0; iVar7 != (int)lVar18; lVar18 = lVar18 + 1) {
      fVar22 = *(float *)((long)pvVar13 + lVar18 * 4);
      *(float *)((long)pvVar8 + lVar18 * 4) = fVar22 * fVar22;
    }
    pvVar8 = (void *)((long)pvVar8 +
                     local_f8.cstep *
                     CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
    pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
  }
  iVar11 = (this->super_LRN).region_type;
  local_170 = opt;
  if (iVar11 == 0) {
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168.elemsize._4_4_ = 0;
    local_168.elempack = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,uVar6,_h,uVar19,sVar1,opt->workspace_allocator);
    if ((local_168.data == (void *)0x0) || (local_168.cstep * (long)local_168.c == 0)) {
      piVar4 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            free(local_168.data);
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar7 = -100;
      goto LAB_002ebdcf;
    }
    uVar6 = (int)local_168.cstep * local_168.c;
    uVar16 = 0;
    uVar17 = (ulong)uVar6;
    if ((int)uVar6 < 1) {
      uVar17 = uVar16;
    }
    for (; (int)uVar17 != (int)uVar16; uVar16 = uVar16 + 1) {
      *(undefined4 *)((long)local_168.data + uVar16 * 4) = 0;
    }
    iVar10 = (this->super_LRN).local_size;
    local_170 = (Option *)CONCAT44(local_170._4_4_,(this->super_LRN).alpha);
    local_100 = (long)iVar10 / -2 & 0xffffffff;
    pvVar13 = bottom_top_blob->data;
    sVar1 = bottom_top_blob->cstep;
    local_110 = (long)(iVar10 / 2);
    sVar2 = bottom_top_blob->elemsize;
    local_108 = (void *)(local_168.cstep *
                        CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize));
    uVar17 = 0;
    pvVar8 = local_168.data;
    local_118 = uVar20;
    while (uVar17 != local_118) {
      lVar18 = local_168.cstep * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize) *
               uVar17;
      for (uVar6 = (int)local_100 + (int)uVar17; (long)(int)uVar6 <= (long)(local_110 + uVar17);
          uVar6 = uVar6 + 1) {
        if ((int)uVar6 < (int)uVar19 && -1 < (int)uVar6) {
          for (lVar15 = 0; iVar7 != (int)lVar15; lVar15 = lVar15 + 1) {
            *(float *)((long)local_168.data + lVar15 * 4 + lVar18) =
                 *(float *)((long)local_168.data + lVar15 * 4 + lVar18) +
                 *(float *)((long)local_f8.data +
                           lVar15 * 4 +
                           (ulong)uVar6 *
                           local_f8.cstep *
                           CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize));
          }
        }
      }
      local_178 = (Mat *)uVar17;
      for (lVar18 = 0; iVar7 != (int)lVar18; lVar18 = lVar18 + 1) {
        fVar22 = powf(*(float *)((long)pvVar8 + lVar18 * 4) * local_170._0_4_ *
                      (1.0 / (float)iVar10) + (this->super_LRN).bias,-(this->super_LRN).beta);
        *(float *)((long)pvVar13 + lVar18 * 4) = fVar22 * *(float *)((long)pvVar13 + lVar18 * 4);
      }
      pvVar13 = (void *)((long)pvVar13 + sVar1 * sVar2);
      pvVar8 = (void *)((long)pvVar8 + (long)local_108);
      uVar17 = (long)local_178 + 1;
    }
    piVar4 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_168.allocator == (Allocator *)0x0) goto LAB_002ec41e;
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  else {
    iVar7 = 0;
    if (iVar11 != 1) goto LAB_002ebdcf;
    piVar4 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    local_168.data = local_f8.data;
    local_168.refcount._0_4_ = local_f8.refcount._0_4_;
    local_168.refcount._4_4_ = local_f8.refcount._4_4_;
    local_168.elemsize._0_4_ = (undefined4)local_f8.elemsize;
    local_168.elemsize._4_4_ = local_f8.elemsize._4_4_;
    local_168.elempack = local_f8.elempack;
    local_168.allocator = local_f8.allocator;
    local_168.dims = local_f8.dims;
    local_168.w = local_f8.w;
    local_168.h = local_f8.h;
    local_168.d = local_f8.d;
    local_168.c = local_f8.c;
    local_168.cstep = local_f8.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    uVar19 = (this->super_LRN).local_size;
    uVar9 = uVar6;
    if (1 < (int)uVar19) {
      uVar9 = uVar19 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border(&local_f8,&local_168,uVar9,~uVar9 + uVar19,uVar9,~uVar9 + uVar19,0,0.0,
                       (Option *)&_space_ofs);
      if ((local_168.data == (void *)0x0) || ((long)local_168.c * local_168.cstep == 0)) {
        piVar4 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
        iVar7 = iVar10;
        if (piVar4 != (int *)0x0) {
          LOCK();
          *piVar4 = *piVar4 + -1;
          UNLOCK();
          if (*piVar4 == 0) {
            if (local_168.allocator == (Allocator *)0x0) {
              free(local_168.data);
            }
            else {
              (*(local_168.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        goto LAB_002ebdcf;
      }
      uVar19 = (this->super_LRN).local_size;
      uVar9 = local_168.w;
    }
    uVar19 = uVar19 * uVar19;
    fVar22 = (this->super_LRN).alpha;
    local_178 = bottom_top_blob;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar19,&local_179);
    piVar5 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = (this->super_LRN).local_size;
    iVar11 = uVar9 - iVar7;
    lVar18 = 0;
    iVar10 = 0;
    for (iVar12 = 0; iVar12 < iVar7; iVar12 = iVar12 + 1) {
      for (lVar15 = 0; iVar14 = (int)lVar15, iVar14 < iVar7; lVar15 = lVar15 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar18 + lVar15] = iVar10 + iVar14;
        iVar7 = (this->super_LRN).local_size;
      }
      iVar10 = iVar10 + iVar11 + iVar14;
      lVar18 = (int)lVar18 + lVar15;
    }
    local_90 = local_178->cstep * local_178->elemsize;
    local_98 = local_168.cstep * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize);
    local_80 = (long)local_168.w * CONCAT44(local_168.elemsize._4_4_,(undefined4)local_168.elemsize)
    ;
    if ((int)uVar6 < 1) {
      uVar6 = 0;
    }
    local_a0 = local_178->data;
    if ((int)_h < 1) {
      uVar17 = 0;
    }
    local_a8 = local_168.data;
    local_178 = (Mat *)CONCAT44(local_178._4_4_,1.0 / (float)(int)uVar19);
    uVar16 = 0;
    local_170 = (Option *)this;
    local_118 = uVar20;
    while (uVar16 != local_118) {
      pvVar13 = (void *)(local_90 * uVar16 + (long)local_a0);
      local_108 = (void *)(local_98 * uVar16 + (long)local_a8);
      uVar20 = 0;
      local_88 = uVar16;
      while (pvVar8 = local_108, uVar20 != uVar17) {
        lVar18 = local_80 * uVar20;
        local_100 = uVar20;
        for (uVar16 = 0; uVar16 != uVar6; uVar16 = uVar16 + 1) {
          fVar21 = 0.0;
          for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
            fVar21 = fVar21 + *(float *)((long)pvVar8 +
                                        (long)piVar5[uVar20] * 4 + uVar16 * 4 + lVar18);
          }
          fVar21 = powf(fVar21 * fVar22 * local_178._0_4_ + *(float *)&local_170[3].use_bf16_storage
                        ,-*(float *)&local_170[3].use_winograd_convolution);
          *(float *)((long)pvVar13 + uVar16 * 4) = fVar21 * *(float *)((long)pvVar13 + uVar16 * 4);
        }
        pvVar13 = (void *)((long)pvVar13 + local_110 * 4);
        uVar20 = local_100 + 1;
      }
      uVar16 = local_88 + 1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
    piVar4 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
LAB_002ec41e:
          free(local_168.data);
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  iVar7 = 0;
LAB_002ebdcf:
  piVar4 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_f8.allocator == (Allocator *)0x0) {
        free(local_f8.data);
      }
      else {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar7;
}

Assistant:

int LRN_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}